

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void __thiscall
wasm::
CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::
doEndBranch(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            *this,RelevantLiveLocalsWalker *self,Expression **currp)

{
  Id IVar1;
  BranchUtils *this_00;
  size_t sVar2;
  pointer ppEVar3;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_01;
  bool bVar4;
  bool bVar5;
  mapped_type *this_02;
  _Base_ptr p_Var6;
  BasicBlock *__from;
  uint uVar7;
  char *__to;
  Expression *pEVar8;
  Expression *pEVar9;
  array<wasm::Expression_*,_10UL> *paVar10;
  undefined1 local_70 [8];
  NameSet branchTargets;
  
  this_00 = (BranchUtils *)
            (self->
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            replacep;
  branchTargets._M_t._M_impl._0_4_ = 0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&branchTargets;
  branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&branchTargets;
  BranchUtils::
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            (this_00,(Expression *)local_70,(anon_class_8_1_ba1d7401)currp);
  if (branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)&branchTargets) {
    p_Var6 = branchTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      sVar2 = (this->
              super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).controlFlowStack.usedFixed;
      ppEVar3 = (this->
                super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).controlFlowStack.flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar8 = (Expression *)
               ((long)(this->
                      super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      ).controlFlowStack.flexible.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
      if ((long)&pEVar8->_id + sVar2 == 0) {
        __assert_fail("!controlFlowStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                      ,0x18b,
                      "Expression *wasm::ControlFlowWalker<RelevantLiveLocalsWalker>::findBreakTarget(Name) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                     );
      }
      uVar7 = ((int)sVar2 + (int)pEVar8) - 1;
      do {
        paVar10 = (array<wasm::Expression_*,_10UL> *)(ppEVar3 + -10);
        if (uVar7 < 10) {
          paVar10 = &(this->
                     super_ControlFlowWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                     ).controlFlowStack.fixed;
        }
        pEVar9 = paVar10->_M_elems[uVar7];
        IVar1 = pEVar9->_id;
        if ((int)IVar1 < 3) {
          if (IVar1 != BlockId) {
            if (IVar1 != IfId) {
LAB_0065baec:
              __assert_fail("curr->template is<If>() || curr->template is<Try>()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                            ,0x199,
                            "Expression *wasm::ControlFlowWalker<RelevantLiveLocalsWalker>::findBreakTarget(Name) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                           );
            }
            goto LAB_0065ba2e;
          }
          if ((_Base_ptr)pEVar9[1].type.id != p_Var6[1]._M_parent) goto LAB_0065ba36;
          bVar4 = false;
          pEVar8 = pEVar9;
        }
        else {
          if (IVar1 == LoopId) {
            if ((_Base_ptr)pEVar9[1].type.id != p_Var6[1]._M_parent) goto LAB_0065ba2e;
            bVar4 = false;
          }
          else {
            if (IVar1 != TryId) goto LAB_0065baec;
LAB_0065ba2e:
            bVar4 = true;
            pEVar9 = pEVar8;
          }
          pEVar8 = pEVar9;
          if (bVar4) {
LAB_0065ba36:
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
        }
        bVar5 = false;
        if (bVar4) {
          if (uVar7 == 0) {
            uVar7 = 0;
            pEVar8 = (Expression *)0x0;
          }
          else {
            uVar7 = uVar7 - 1;
            bVar5 = true;
          }
        }
        else {
          bVar5 = false;
        }
      } while (bVar5);
      branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pEVar8;
      this_02 = std::
                map<wasm::Expression_*,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                ::operator[](&this->branches,
                             (key_type *)
                             &branchTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::push_back(this_02,&this->currBasicBlock);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)&branchTargets);
  }
  if (*(long *)(this_00 + 8) == 1) {
    this->currBasicBlock = (BasicBlock *)0x0;
  }
  else {
    this_01 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               *)this->currBasicBlock;
    __from = startBasicBlock(this);
    link(this_01,(char *)__from,__to);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_70);
  return;
}

Assistant:

static void doEndBranch(SubType* self, Expression** currp) {
    auto* curr = *currp;
    auto branchTargets = BranchUtils::getUniqueTargets(curr);
    // Add branches to the targets.
    for (auto target : branchTargets) {
      self->branches[self->findBreakTarget(target)].push_back(
        self->currBasicBlock);
    }
    if (curr->type != Type::unreachable) {
      auto* last = self->currBasicBlock;
      self->link(last, self->startBasicBlock()); // we might fall through
    } else {
      self->startUnreachableBlock();
    }
  }